

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
::clear(Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *this,ID_index rowIndex)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  void *pvVar4;
  node_ptr plVar5;
  node_ptr plVar6;
  node_ptr next;
  __node_base_ptr p_Var7;
  _Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
  __it;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *entry;
  key_type local_28;
  
  local_28 = (key_type)operator_new(0x20);
  (local_28->super_Entry_column_index_option).columnIndex_ = 0xffffffff;
  (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_28->rowIndex_ = rowIndex;
  __it._M_cur = (__node_type *)0x0;
  p_Var7 = std::
           _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(this->column_)._M_h,(ulong)rowIndex % (this->column_)._M_h._M_bucket_count,
                      &local_28,(ulong)rowIndex);
  if (p_Var7 != (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)p_Var7->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    if ((this->super_Row_access_option).rows_ != (Row_container *)0x0) {
      lVar1 = *(long *)((long)__it._M_cur + 8);
      lVar2 = *(long *)(lVar1 + 8);
      if (lVar2 != 0) {
        plVar3 = *(long **)(lVar1 + 0x10);
        *plVar3 = lVar2;
        *(long **)(lVar2 + 8) = plVar3;
        *(undefined8 *)(lVar1 + 8) = 0;
        *(undefined8 *)(lVar1 + 0x10) = 0;
      }
    }
    pvVar4 = *(void **)((long)__it._M_cur + 8);
    if (pvVar4 != (void *)0x0) {
      lVar1 = *(long *)((long)pvVar4 + 8);
      if (lVar1 != 0) {
        plVar3 = *(long **)((long)pvVar4 + 0x10);
        *plVar3 = lVar1;
        *(long **)(lVar1 + 8) = plVar3;
        *(undefined8 *)((long)pvVar4 + 8) = 0;
        *(undefined8 *)((long)pvVar4 + 0x10) = 0;
      }
      operator_delete(pvVar4,0x20);
    }
    std::
    _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::erase(&(this->column_)._M_h,(const_iterator)__it._M_cur);
  }
  if (local_28 != (key_type)0x0) {
    plVar5 = (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (plVar5 != (node_ptr)0x0) {
      plVar6 = (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar6->next_ = plVar5;
      plVar5->prev_ = plVar6;
      (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
      ;
      (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
      ;
    }
    operator_delete(local_28,0x20);
  }
  return;
}

Assistant:

inline void Unordered_set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto entry = entryPool_->construct(rowIndex);
  auto it = column_.find(entry);
  if (it != column_.end()) {
    _delete_entry(it);
  }
  entryPool_->destroy(entry);
}